

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O3

Data * Data::mod(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  pointer ppDVar1;
  Data *pDVar2;
  Integer *this;
  long lVar3;
  long lVar4;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  pointer ppDVar5;
  long local_38;
  
  this = (Integer *)operator_new(0x18);
  ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = __dynamic_cast(*ppDVar5,&typeinfo,&Integer::typeinfo,0);
  lVar3 = *(long *)(lVar3 + 0x10);
  lVar4 = __dynamic_cast(ppDVar5[1],&typeinfo,&Integer::typeinfo,0);
  local_38 = lVar3 % *(long *)(lVar4 + 0x10);
  Integer::Integer(this,&local_38);
  ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppDVar1 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar5 != ppDVar1) {
    do {
      pDVar2 = *ppDVar5;
      if ((pDVar2 != (Data *)0x0) && (pDVar2->cited == 0)) {
        (*pDVar2->_vptr_Data[1])();
      }
      ppDVar5 = ppDVar5 + 1;
    } while (ppDVar5 != ppDVar1);
    ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppDVar5 != (pointer)0x0) {
    operator_delete(ppDVar5);
  }
  operator_delete(dataPara);
  return &this->super_Data;
}

Assistant:

Data *Data::mod(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    result = new Integer(
            (dynamic_cast<Integer *>((*dataPara)[0]))->value
            % (dynamic_cast<Integer *>((*dataPara)[1]))->value
    );
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}